

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Map.cpp
# Opt level: O0

void __thiscall RenX::Map::Map(Map *this,string_view in_name)

{
  Map *this_local;
  string_view in_name_local;
  
  in_name_local._M_len = (size_t)in_name._M_str;
  this_local = (Map *)in_name._M_len;
  Map(this);
  std::__cxx11::string::operator=
            ((string *)&this->name,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  return;
}

Assistant:

RenX::Map::Map(std::string_view in_name) : Map()
{
	name = in_name;
}